

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(void)

{
  server_init();
  set_static_folder("./examples/");
  register_url("/home",hello_page);
  register_static_url("/login","./examples/temp2.html");
  server_listen();
  return 0;
}

Assistant:

int main() {
    // initialize all memory for server
    server_init();
    // set static folder
    set_static_folder("./examples/");
    // register our function in dispatcher
    register_url("/home", hello_page);
    // or register html page from some file
    register_static_url("/login", "./examples/temp2.html");
    // start to listen on 8000 port
    server_listen();
}